

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O2

void adios2sysMD5_DigestToHex(uchar *digest,char *buffer)

{
  long lVar1;
  char *out;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    buffer[lVar1 * 2] = "0123456789abcdef"[digest[lVar1] >> 4];
    buffer[lVar1 * 2 + 1] = "0123456789abcdef"[digest[lVar1] & 0xf];
  }
  return;
}

Assistant:

void kwsysMD5_DigestToHex(unsigned char const digest[16], char buffer[32])
{
  /* Map from 4-bit index to hexadecimal representation.  */
  static char const hex[16] = { '0', '1', '2', '3', '4', '5', '6', '7',
                                '8', '9', 'a', 'b', 'c', 'd', 'e', 'f' };

  /* Map each 4-bit block separately.  */
  char* out = buffer;
  int i;
  for (i = 0; i < 16; ++i) {
    *out++ = hex[digest[i] >> 4];
    *out++ = hex[digest[i] & 0xF];
  }
}